

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptRegExp::DeleteProperty
          (JavascriptRegExp *this,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *pSVar3;
  ScriptConfiguration *this_00;
  ScriptContext *pSVar4;
  PropertyRecord *pPVar5;
  char16 *pcVar6;
  ScriptConfiguration *scriptConfig;
  PropertyOperationFlags propertyOperationFlags_local;
  PropertyId propertyId_local;
  JavascriptRegExp *this_local;
  
  pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_00 = ScriptContext::GetConfig(pSVar3);
  if ((propertyId != 0x153) && (propertyId != 0x1a0)) {
    if (propertyId == 0x1a2) {
      pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      pPVar5 = ScriptContext::GetPropertyName(pSVar4,0x1a2);
      pcVar6 = PropertyRecord::GetBuffer(pPVar5);
      JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags,pSVar3,pcVar6);
      return 0;
    }
    if (propertyId != 0x1a3) {
      if (propertyId == 0x1a4) {
        bVar1 = ScriptConfiguration::IsES2018RegExDotAllEnabled(this_00);
        if ((bVar1) &&
           (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00), !bVar1)) {
          pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
          pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
          pPVar5 = ScriptContext::GetPropertyName(pSVar4,0x1a4);
          pcVar6 = PropertyRecord::GetBuffer(pPVar5);
          JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags,pSVar3,pcVar6);
          return 0;
        }
        BVar2 = DynamicObject::DeleteProperty
                          (&this->super_DynamicObject,0x1a4,propertyOperationFlags);
        return BVar2;
      }
      if (propertyId != 0x1a5) {
        if (propertyId == 0x1a6) {
          bVar1 = ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_00);
          if ((bVar1) &&
             (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00), !bVar1)) {
            pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
            pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
            pPVar5 = ScriptContext::GetPropertyName(pSVar4,0x1a6);
            pcVar6 = PropertyRecord::GetBuffer(pPVar5);
            JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags,pSVar3,pcVar6);
            return 0;
          }
          BVar2 = DynamicObject::DeleteProperty
                            (&this->super_DynamicObject,0x1a6,propertyOperationFlags);
          return BVar2;
        }
        if (propertyId == 0x1a7) {
          bVar1 = ScriptConfiguration::IsES6RegExStickyEnabled(this_00);
          if ((bVar1) &&
             (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00), !bVar1)) {
            pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
            pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
            pPVar5 = ScriptContext::GetPropertyName(pSVar4,0x1a7);
            pcVar6 = PropertyRecord::GetBuffer(pPVar5);
            JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags,pSVar3,pcVar6);
            return 0;
          }
          BVar2 = DynamicObject::DeleteProperty
                            (&this->super_DynamicObject,0x1a7,propertyOperationFlags);
          return BVar2;
        }
        if (propertyId != 0x1e0) {
          BVar2 = DynamicObject::DeleteProperty
                            (&this->super_DynamicObject,propertyId,propertyOperationFlags);
          return BVar2;
        }
      }
    }
  }
  bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00);
  if (bVar1) {
    this_local._4_4_ =
         DynamicObject::DeleteProperty(&this->super_DynamicObject,propertyId,propertyOperationFlags)
    ;
  }
  else {
    pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    pPVar5 = ScriptContext::GetPropertyName(pSVar4,propertyId);
    pcVar6 = PropertyRecord::GetBuffer(pPVar5);
    JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags,pSVar3,pcVar6);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptRegExp::DeleteProperty(PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define DELETE_PROPERTY(ownProperty) \
        if (ownProperty) \
        { \
            JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags, this->GetScriptContext(), this->GetScriptContext()->GetPropertyName(propertyId)->GetBuffer()); \
            return false; \
        } \
        return DynamicObject::DeleteProperty(propertyId, propertyOperationFlags);

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            DELETE_PROPERTY(true);
        case PropertyIds::global:
        case PropertyIds::multiline:
        case PropertyIds::ignoreCase:
        case PropertyIds::source:
        case PropertyIds::options:
            DELETE_PROPERTY(!scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::dotAll:
            DELETE_PROPERTY(scriptConfig->IsES2018RegExDotAllEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::unicode:
            DELETE_PROPERTY(scriptConfig->IsES6UnicodeExtensionsEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::sticky:
            DELETE_PROPERTY(scriptConfig->IsES6RegExStickyEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        default:
            return DynamicObject::DeleteProperty(propertyId, propertyOperationFlags);
        }

#undef DELETE_PROPERTY
    }